

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-term.c
# Opt level: O3

errr Term_fresh(void)

{
  _Bool _Var1;
  term_win *ptVar2;
  int **ppiVar3;
  wchar_t **ppwVar4;
  int **ppiVar5;
  wchar_t **ppwVar6;
  wchar_t *pwVar7;
  int *piVar8;
  term_win *ptVar9;
  int *piVar10;
  int *piVar11;
  int iVar12;
  int iVar13;
  byte bVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  wchar_t wVar18;
  wchar_t wVar19;
  wchar_t wVar20;
  wchar_t wVar21;
  code *pcVar22;
  void *p;
  void *pvVar23;
  uint uVar24;
  wchar_t *pwVar25;
  wchar_t wVar26;
  wchar_t wVar27;
  ulong uVar28;
  ulong uVar29;
  wchar_t *pwVar30;
  long lVar31;
  wchar_t *pwVar32;
  int iVar33;
  long lVar34;
  wchar_t *pwVar35;
  int *piVar36;
  wchar_t *pwVar37;
  term_win *ptVar38;
  int iVar39;
  wchar_t wVar40;
  long lVar41;
  wchar_t wVar42;
  wchar_t wVar43;
  term *ptVar44;
  bool bVar45;
  wchar_t nta;
  wchar_t na;
  wchar_t nc;
  int *local_1a8;
  wchar_t *local_1a0;
  wchar_t *local_180;
  int *local_178;
  int local_16c;
  int *local_160;
  wchar_t *local_158;
  wchar_t local_150;
  wchar_t local_14c;
  void *local_148;
  wchar_t *local_140;
  ulong local_138;
  wchar_t local_12c;
  ulong local_128;
  term_win *local_120;
  wchar_t local_114;
  ulong local_110;
  long local_108;
  wchar_t *local_100;
  wchar_t local_f4;
  wchar_t *local_f0;
  wchar_t *local_e8;
  int *local_e0;
  wchar_t *local_d8;
  wchar_t *local_d0;
  wchar_t *local_c8;
  int *local_c0;
  wchar_t *local_b8;
  wchar_t *local_b0;
  wchar_t *local_a8;
  int *local_a0;
  wchar_t *local_98;
  wchar_t *local_90;
  int *local_88;
  wchar_t *local_80;
  int *local_78;
  int *local_70;
  wchar_t *local_68;
  int *local_60;
  wchar_t *local_58;
  int *local_50;
  wchar_t *local_48;
  int *local_40;
  size_t local_38;
  
  ptVar44 = Term;
  if (Term->mapped_flag != true) {
    return 1;
  }
  uVar17 = Term->wid;
  uVar24 = Term->hgt;
  iVar39 = Term->y1;
  iVar15 = Term->y2;
  ptVar38 = Term->old;
  ptVar2 = Term->scr;
  if ((((iVar15 < iVar39) && (ptVar2->cu == ptVar38->cu)) && (ptVar2->cv == ptVar38->cv)) &&
     (((ptVar2->cx == ptVar38->cx && (ptVar2->cy == ptVar38->cy)) &&
      ((ptVar2->cnx == ptVar38->cnx &&
       ((ptVar2->cny == ptVar38->cny && (Term->total_erase != true)))))))) {
    return 1;
  }
  pcVar22 = Term->curs_hook;
  if (pcVar22 == (_func_errr_wchar_t_wchar_t *)0x0) {
    pcVar22 = Term_curs_hack;
    Term->curs_hook = Term_curs_hack;
  }
  if (ptVar44->bigcurs_hook == (_func_errr_wchar_t_wchar_t *)0x0) {
    ptVar44->bigcurs_hook = pcVar22;
  }
  if (ptVar44->wipe_hook == (_func_errr_wchar_t_wchar_t_wchar_t *)0x0) {
    ptVar44->wipe_hook = Term_wipe_hack;
  }
  if (ptVar44->text_hook == (_func_errr_wchar_t_wchar_t_wchar_t_wchar_t_wchar_t_ptr *)0x0) {
    ptVar44->text_hook = Term_text_hack;
  }
  if (ptVar44->pict_hook ==
      (_func_errr_wchar_t_wchar_t_wchar_t_wchar_t_ptr_wchar_t_ptr_wchar_t_ptr_wchar_t_ptr *)0x0) {
    ptVar44->pict_hook = Term_pict_hack;
  }
  local_120 = ptVar38;
  if (ptVar44->total_erase == true) {
    if (ptVar44->xtra_hook != (_func_errr_wchar_t_wchar_t *)0x0) {
      (*ptVar44->xtra_hook)(L'\x03',L'\0');
    }
    ptVar38->cu = false;
    ptVar38->cv = false;
    ptVar38->cx = 0;
    ptVar38->cy = 0;
    ptVar38->cnx = 1;
    ptVar44 = Term;
    ptVar38->cny = 1;
    if ((int)uVar24 < 1) {
      Term->y1 = 0;
      ptVar44->y2 = uVar24 - 1;
    }
    else {
      ppiVar3 = ptVar38->a;
      ppwVar4 = ptVar38->c;
      ppiVar5 = ptVar38->ta;
      ppwVar6 = ptVar38->tc;
      uVar29 = 0;
      do {
        if (0 < (int)uVar17) {
          pwVar35 = ppwVar6[uVar29];
          piVar36 = ppiVar5[uVar29];
          pwVar7 = ppwVar4[uVar29];
          piVar8 = ppiVar3[uVar29];
          lVar41 = 0;
          do {
            piVar8[lVar41] = 1;
            pwVar7[lVar41] = L' ';
            piVar36[lVar41] = 1;
            pwVar35[lVar41] = L' ';
            lVar41 = lVar41 + 1;
          } while (uVar17 != (uint)lVar41);
        }
        ptVar44 = Term;
        uVar29 = uVar29 + 1;
      } while (uVar29 != uVar24);
      Term->y1 = 0;
      ptVar44->y2 = uVar24 - 1;
      ptVar38 = local_120;
      if (0 < (int)uVar24) {
        piVar36 = ptVar44->x1;
        piVar8 = ptVar44->x2;
        uVar29 = 0;
        do {
          piVar36[uVar29] = 0;
          piVar8[uVar29] = uVar17 - 1;
          uVar29 = uVar29 + 1;
        } while (uVar24 != uVar29);
      }
    }
    iVar15 = uVar24 - 1;
    ptVar44->total_erase = false;
    iVar39 = 0;
  }
  iVar12 = iVar15;
  if (ptVar44->soft_cursor == true) {
    if ((ptVar38->cu == false) && (ptVar38->cv == true)) {
      iVar33 = ptVar38->cy;
      lVar41 = (long)iVar33;
      uVar16 = ptVar38->cny + iVar33;
      if ((int)uVar24 <= (int)uVar16) {
        uVar16 = uVar24;
      }
      iVar12 = uVar16 - 1;
      if ((int)(uVar16 - 1) < iVar33) {
        iVar12 = iVar33;
      }
      iVar33 = ptVar38->cx;
      uVar16 = ptVar38->cnx + iVar33;
      if ((int)uVar17 <= (int)uVar16) {
        uVar16 = uVar17;
      }
      iVar13 = uVar16 - 1;
      if ((int)(uVar16 - 1) < iVar33) {
        iVar13 = iVar33;
      }
      piVar36 = ptVar44->x1;
      piVar8 = ptVar44->x2;
      do {
        iVar33 = ptVar38->cx;
        if (iVar33 <= iVar13) {
          pwVar35 = ptVar2->c[lVar41];
          pwVar7 = ptVar38->c[lVar41];
          lVar34 = 0;
          do {
            pwVar7[iVar33 + lVar34] = ~pwVar35[iVar33 + lVar34];
            lVar34 = lVar34 + 1;
          } while ((iVar13 + 1) - iVar33 != (int)lVar34);
          iVar33 = local_120->cx;
          ptVar38 = local_120;
        }
        if (iVar33 < piVar36[lVar41]) {
          piVar36[lVar41] = iVar33;
        }
        if (piVar8[lVar41] < iVar13) {
          piVar8[lVar41] = iVar13;
        }
        lVar41 = lVar41 + 1;
      } while (iVar12 + 1 != (int)lVar41);
      if (ptVar38->cy <= iVar39) {
        iVar39 = ptVar38->cy;
      }
      if (iVar12 < iVar15) {
        iVar12 = iVar15;
      }
    }
  }
  else if (((ptVar2->cu != false) || (ptVar2->cv == false)) &&
          (ptVar44->xtra_hook != (_func_errr_wchar_t_wchar_t *)0x0)) {
    (*ptVar44->xtra_hook)(L'\x04',L'\0');
    ptVar44 = Term;
  }
  if (iVar39 <= iVar12) {
    if ((ptVar44->dblh_hook == (_func_wchar_t_wchar_t_wchar_t *)0x0) ||
       ((ptVar44->always_pict == false && (ptVar44->higher_pict != true)))) {
      p = (void *)0x0;
    }
    else {
      p = mem_alloc((ulong)tile_height << 3);
      if (tile_height != '\0') {
        uVar29 = 0;
        do {
          pvVar23 = mem_zalloc((long)(int)uVar17 << 2);
          *(void **)((long)p + uVar29 * 8) = pvVar23;
          uVar29 = uVar29 + 1;
        } while (uVar29 < tile_height);
      }
    }
    ptVar44 = Term;
    if ((Term->icky_corner == true) && ((int)(uVar24 - 1) <= iVar12)) {
      if ((int)(uVar17 - 2) < Term->x2[(long)(int)uVar24 + -1]) {
        Term->x2[(long)(int)uVar24 + -1] = uVar17 - 2;
      }
    }
    ptVar44->y1 = uVar24;
    ptVar44->y2 = 0;
    local_38 = (ulong)uVar17 * 4;
    lVar41 = (long)iVar39;
    local_16c = 0;
    local_148 = p;
LAB_001ef608:
    piVar36 = ptVar44->x2;
    lVar41 = lVar41 + 1;
    while( true ) {
      uVar24 = ptVar44->x1[lVar41 + -1];
      lVar34 = (long)(int)uVar24;
      uVar16 = piVar36[lVar41 + -1];
      if ((int)uVar24 <= (int)uVar16) break;
      if (p != (void *)0x0) {
        if (0 < (int)uVar17) {
          memset(*(void **)((long)p + (long)local_16c * 8),0,local_38);
          p = local_148;
        }
        local_16c = (local_16c + 1) % (int)(uint)tile_height;
        goto LAB_001f0d89;
      }
      lVar41 = lVar41 + 1;
      if ((int)lVar41 + -iVar12 == 2) goto LAB_001ef3c8;
    }
    uVar29 = (ulong)uVar24;
    ptVar44->x1[lVar41 + -1] = uVar17;
    piVar36[lVar41 + -1] = 0;
    lVar31 = lVar41 + -1;
    wVar27 = (wchar_t)lVar31;
    local_128 = uVar29;
    local_108 = lVar41;
    if (ptVar44->always_pict == true) {
      if (ptVar44->dblh_hook == (_func_wchar_t_wchar_t_wchar_t *)0x0) {
        ptVar38 = ptVar44->old;
        ptVar9 = ptVar44->scr;
        piVar36 = ptVar9->a[lVar41 + -1];
        pwVar7 = ptVar9->c[lVar41 + -1];
        piVar8 = ptVar9->ta[lVar41 + -1];
        pwVar37 = ptVar9->tc[lVar41 + -1];
        local_138 = (ulong)((uVar16 - uVar24) + 1);
        pwVar35 = piVar8 + lVar34;
        pwVar32 = ptVar38->tc[lVar41 + -1];
        piVar10 = ptVar38->ta[lVar41 + -1];
        pwVar30 = ptVar38->c[lVar41 + -1];
        piVar11 = ptVar38->a[lVar41 + -1];
        lVar41 = 0;
        wVar21 = L'\0';
        wVar42 = L'\0';
        local_140 = pwVar35;
        do {
          wVar18 = pwVar7[lVar34 + lVar41];
          wVar19 = pwVar35[lVar41];
          wVar40 = pwVar37[lVar34 + lVar41];
          if ((((piVar36[lVar34 + lVar41] == piVar11[lVar34 + lVar41]) &&
               (wVar18 == pwVar30[lVar34 + lVar41])) && (wVar19 == piVar10[lVar34 + lVar41])) &&
             (wVar40 == pwVar32[lVar34 + lVar41])) {
            if (wVar21 != L'\0') {
              (*Term->pict_hook)(wVar42,wVar27,wVar21,piVar36 + wVar42,pwVar7 + wVar42,
                                 piVar8 + wVar42,pwVar37 + wVar42);
              uVar29 = local_128;
              pwVar35 = local_140;
            }
            wVar21 = L'\0';
          }
          else {
            piVar11[lVar34 + lVar41] = piVar36[lVar34 + lVar41];
            pwVar30[lVar34 + lVar41] = wVar18;
            piVar10[lVar34 + lVar41] = wVar19;
            pwVar32[lVar34 + lVar41] = wVar40;
            bVar45 = wVar21 == L'\0';
            wVar21 = wVar21 + L'\x01';
            if (bVar45) {
              wVar42 = (int)uVar29 + (int)lVar41;
            }
          }
          lVar41 = lVar41 + 1;
        } while ((int)local_138 != (int)lVar41);
        p = local_148;
        ptVar38 = local_120;
        if (wVar21 != L'\0') {
          (*Term->pict_hook)(wVar42,(int)local_108 + L'\xffffffff',wVar21,piVar36 + wVar42,
                             pwVar7 + wVar42,piVar8 + wVar42,pwVar37 + wVar42);
          p = local_148;
          ptVar38 = local_120;
        }
      }
      else {
        ptVar38 = ptVar44->old;
        ptVar9 = ptVar44->scr;
        local_78 = ptVar9->a[lVar41 + -1];
        local_80 = ptVar9->c[lVar41 + -1];
        local_88 = ptVar9->ta[lVar41 + -1];
        local_90 = ptVar9->tc[lVar41 + -1];
        piVar36 = local_78;
        local_140 = local_90;
        local_1a8 = local_78;
        local_1a0 = local_80;
        local_180 = local_90;
        local_178 = local_88;
        local_160 = local_88;
        local_158 = local_80;
        if (lVar31 < (long)((long)ptVar44->hgt - (ulong)tile_height)) {
          lVar31 = (ulong)tile_height + lVar41;
          piVar36 = ptVar9->a[lVar31 + -1];
          local_1a0 = ptVar9->c[lVar31 + -1];
          local_178 = ptVar9->ta[lVar31 + -1];
          local_140 = ptVar9->tc[lVar31 + -1];
          local_1a8 = ptVar38->a[lVar31 + -1];
          local_158 = ptVar38->c[lVar31 + -1];
          local_160 = ptVar38->ta[lVar31 + -1];
          local_180 = ptVar38->tc[lVar31 + -1];
        }
        local_100 = *(wchar_t **)((long)local_148 + (long)local_16c * 8);
        piVar8 = ptVar38->a[lVar41 + -1];
        pwVar7 = ptVar38->c[lVar41 + -1];
        piVar10 = ptVar38->ta[lVar41 + -1];
        pwVar35 = ptVar38->tc[lVar41 + -1];
        local_138 = (ulong)uVar16;
        if (0 < (int)uVar24) {
          memset(local_100,0,uVar29 * 4);
        }
        piVar11 = local_88;
        uVar24 = (int)local_138 + 1;
        local_138 = (ulong)uVar24;
        local_d0 = local_140 + lVar34;
        local_40 = local_178 + lVar34;
        local_48 = local_1a0 + lVar34;
        local_50 = piVar36 + lVar34;
        local_58 = local_180 + lVar34;
        local_60 = local_160 + lVar34;
        local_68 = local_158 + lVar34;
        local_70 = local_1a8 + lVar34;
        pwVar37 = local_100 + lVar34;
        uVar28 = (ulong)(uVar24 - (int)local_128);
        pwVar32 = local_90 + lVar34;
        pwVar35 = pwVar35 + lVar34;
        local_140 = local_80 + lVar34;
        local_e0 = local_78 + lVar34;
        lVar31 = 0;
        wVar42 = L'\0';
        wVar21 = L'\0';
        uVar29 = local_128;
        lVar41 = lVar34;
        pwVar30 = local_100;
        local_110 = uVar28;
        local_f0 = pwVar32;
        local_e8 = pwVar35;
        local_98 = pwVar37;
        do {
          wVar18 = piVar8[lVar34 + lVar31];
          wVar19 = local_e0[lVar31];
          wVar40 = local_140[lVar31];
          wVar43 = piVar11[lVar34 + lVar31];
          wVar26 = pwVar32[lVar31];
          if (((wVar19 == wVar18) && (wVar40 == pwVar7[lVar34 + lVar31])) &&
             ((wVar43 == piVar10[lVar34 + lVar31] && (wVar26 == pwVar35[lVar31])))) {
            pwVar25 = pwVar37;
            if ((local_98[lVar31] != L'\0') &&
               ((wVar18 = (*Term->dblh_hook)(wVar18,wVar40), uVar29 = local_128, uVar28 = local_110,
                pwVar30 = local_100, pwVar32 = local_f0, pwVar35 = local_e8, wVar18 != L'\0' ||
                (wVar18 = (*Term->dblh_hook)(wVar43,wVar26), uVar29 = local_128, uVar28 = local_110,
                pwVar30 = local_100, pwVar32 = local_f0, pwVar35 = local_e8, wVar18 != L'\0'))))
            goto LAB_001efc4a;
            local_f4 = local_60[lVar31];
            local_d8 = (wchar_t *)CONCAT44(local_d8._4_4_,local_58[lVar31]);
            local_a8 = (wchar_t *)CONCAT44(local_a8._4_4_,local_50[lVar31]);
            local_b8 = (wchar_t *)CONCAT44(local_b8._4_4_,local_48[lVar31]);
            local_c0 = (int *)CONCAT44(local_c0._4_4_,local_40[lVar31]);
            local_c8 = (wchar_t *)CONCAT44(local_c8._4_4_,local_d0[lVar31]);
            local_a0 = (int *)CONCAT44(local_a0._4_4_,local_70[lVar31]);
            local_b0 = (wchar_t *)CONCAT44(local_b0._4_4_,local_68[lVar31]);
            wVar18 = (*Term->dblh_hook)(local_70[lVar31],local_68[lVar31]);
            if (wVar18 != L'\0') {
LAB_001efb55:
              uVar29 = local_128;
              uVar28 = local_110;
              pwVar30 = local_100;
              pwVar32 = local_f0;
              pwVar35 = local_e8;
              if ((int)local_a8 == (int)local_a0) {
                if (((int)local_b8 == (int)local_b0) && ((wchar_t)local_c0 == local_f4)) {
                  if ((int)local_c8 == (wchar_t)local_d8) goto LAB_001efbb1;
                }
              }
              goto LAB_001efc4a;
            }
            wVar18 = (*Term->dblh_hook)(local_f4,(wchar_t)local_d8);
            if (wVar18 != L'\0') goto LAB_001efb55;
LAB_001efbb1:
            local_98[lVar31] = L'\0';
            if (wVar42 != L'\0') {
              (*Term->pict_hook)(wVar21,wVar27,wVar42,local_78 + wVar21,local_80 + wVar21,
                                 local_88 + wVar21,local_90 + wVar21);
            }
            wVar42 = L'\0';
            uVar29 = local_128;
            uVar28 = local_110;
            pwVar30 = local_100;
            pwVar32 = local_f0;
            pwVar35 = local_e8;
          }
          else {
            pwVar25 = pwVar30 + lVar41;
LAB_001efc4a:
            *pwVar25 = L'\x01';
            piVar8[lVar34 + lVar31] = wVar19;
            pwVar7[lVar34 + lVar31] = wVar40;
            piVar10[lVar34 + lVar31] = wVar43;
            pwVar35[lVar31] = wVar26;
            bVar45 = wVar42 == L'\0';
            wVar42 = wVar42 + L'\x01';
            if (bVar45) {
              wVar21 = (int)uVar29 + (int)lVar31;
            }
          }
          lVar41 = lVar41 + 1;
          lVar31 = lVar31 + 1;
          pwVar37 = pwVar37 + 1;
        } while ((int)uVar28 != (int)lVar31);
        if (wVar42 != L'\0') {
          (*Term->pict_hook)(wVar21,(int)local_108 + L'\xffffffff',wVar42,local_78 + wVar21,
                             local_80 + wVar21,local_88 + wVar21,local_90 + wVar21);
          pwVar30 = local_100;
        }
        ptVar44 = Term;
        if ((int)local_138 < Term->wid) {
          lVar41 = (long)(int)local_138;
          do {
            pwVar30[lVar41] = L'\0';
            lVar41 = lVar41 + 1;
          } while (lVar41 < ptVar44->wid);
        }
        local_16c = (local_16c + 1) % (int)(uint)tile_height;
        p = local_148;
        ptVar38 = local_120;
      }
    }
    else if (ptVar44->higher_pict == true) {
      if (ptVar44->dblh_hook == (_func_wchar_t_wchar_t_wchar_t *)0x0) {
        ptVar38 = ptVar44->old;
        ptVar9 = ptVar44->scr;
        piVar36 = ptVar38->a[lVar41 + -1];
        pwVar35 = ptVar38->c[lVar41 + -1];
        piVar8 = ptVar9->a[lVar41 + -1];
        pwVar7 = ptVar9->c[lVar41 + -1];
        piVar10 = ptVar38->ta[lVar41 + -1];
        pwVar37 = ptVar38->tc[lVar41 + -1];
        piVar11 = ptVar9->ta[lVar41 + -1];
        pwVar32 = ptVar9->tc[lVar41 + -1];
        local_150 = L'\x01';
        wVar42 = L'\0';
        wVar21 = L'\0';
        local_138 = CONCAT71(local_138._1_7_,ptVar44->always_text);
        bVar14 = ptVar44->always_text;
LAB_001f0907:
        local_140 = (wchar_t *)CONCAT44(local_140._4_4_,local_150);
        local_e0 = (int *)CONCAT71(local_e0._1_7_,local_150 != L'\0' | bVar14);
        lVar34 = lVar34 + 1;
        do {
          wVar18 = piVar36[lVar34 + -1];
          local_150 = piVar8[lVar34 + -1];
          local_12c = pwVar7[lVar34 + -1];
          local_14c = piVar11[lVar34 + -1];
          local_114 = pwVar32[lVar34 + -1];
          iVar39 = (int)lVar34;
          if ((((local_150 == wVar18) && (local_12c == pwVar35[lVar34 + -1])) &&
              (local_14c == piVar10[lVar34 + -1])) && (local_114 == pwVar37[lVar34 + -1])) {
            bVar45 = true;
            if (wVar18 != L'ÿ' && (char)wVar18 < '\0') {
              wVar18 = is_padding_changed(Term,wVar27,iVar39 + L'\xffffffff');
              bVar45 = wVar18 == L'\0';
            }
            if (wVar42 != L'\0') {
              if (((ulong)local_e0 & 1) == 0) {
                (*Term->wipe_hook)(wVar21,wVar27,wVar42);
              }
              else {
                (*Term->text_hook)(wVar21,wVar27,wVar42,(wchar_t)local_140,pwVar7 + wVar21);
              }
            }
            wVar42 = L'\0';
            p = local_148;
            if (!bVar45) {
              (*Term->pict_hook)(iVar39 + L'\xffffffff',wVar27,L'\x01',&local_150,&local_12c,
                                 &local_14c,&local_114);
              p = local_148;
            }
          }
          else {
            piVar36[lVar34 + -1] = local_150;
            pwVar35[lVar34 + -1] = local_12c;
            piVar10[lVar34 + -1] = local_14c;
            pwVar37[lVar34 + -1] = local_114;
            if ((char)local_150 < '\0') {
              if (wVar42 != L'\0') {
                if (((ulong)local_e0 & 1) == 0) {
                  (*Term->wipe_hook)(wVar21,wVar27,wVar42);
                }
                else {
                  (*Term->text_hook)(wVar21,wVar27,wVar42,(wchar_t)local_140,pwVar7 + wVar21);
                }
              }
              wVar42 = L'\0';
              if (local_150 != L'ÿ') {
                (*Term->pict_hook)(iVar39 + L'\xffffffff',wVar27,L'\x01',&local_150,&local_12c,
                                   &local_14c,&local_114);
              }
            }
            else {
              if ((wchar_t)local_140 != local_150) goto LAB_001f0b70;
              bVar45 = wVar42 == L'\0';
              wVar42 = wVar42 + L'\x01';
              if (bVar45) {
                wVar21 = iVar39 + L'\xffffffff';
              }
            }
          }
          lVar34 = lVar34 + 1;
          if ((int)lVar34 + -uVar16 == 2) {
            ptVar38 = local_120;
            if (wVar42 != L'\0') goto LAB_001f0c34;
            goto LAB_001f0d3a;
          }
        } while( true );
      }
      ptVar38 = ptVar44->old;
      ptVar9 = ptVar44->scr;
      local_140 = ptVar9->a[lVar41 + -1];
      pwVar35 = ptVar9->c[lVar41 + -1];
      local_e0 = ptVar9->ta[lVar41 + -1];
      local_100 = ptVar9->tc[lVar41 + -1];
      local_d8 = local_100;
      local_d0 = local_140;
      local_c8 = pwVar35;
      local_c0 = local_e0;
      local_b8 = local_100;
      local_b0 = local_140;
      local_a8 = pwVar35;
      local_a0 = local_e0;
      if (lVar31 < (long)((long)ptVar44->hgt - (ulong)tile_height)) {
        lVar31 = (ulong)tile_height + lVar41;
        local_d0 = ptVar9->a[lVar31 + -1];
        local_c8 = ptVar9->c[lVar31 + -1];
        local_c0 = ptVar9->ta[lVar31 + -1];
        local_b8 = ptVar9->tc[lVar31 + -1];
        local_b0 = ptVar38->a[lVar31 + -1];
        local_a8 = ptVar38->c[lVar31 + -1];
        local_a0 = ptVar38->ta[lVar31 + -1];
        local_d8 = ptVar38->tc[lVar31 + -1];
      }
      pvVar23 = *(void **)((long)local_148 + (long)local_16c * 8);
      piVar36 = ptVar38->a[lVar41 + -1];
      pwVar7 = ptVar38->c[lVar41 + -1];
      piVar8 = ptVar38->ta[lVar41 + -1];
      pwVar37 = ptVar38->tc[lVar41 + -1];
      local_110 = CONCAT71(local_110._1_7_,ptVar44->always_text);
      if (0 < (int)uVar24) {
        memset(pvVar23,0,uVar29 << 2);
      }
      uVar29 = (ulong)(uVar16 + 1);
      wVar18 = L'\0';
      p = local_148;
      local_138 = uVar29;
      wVar42 = L'\x01';
      wVar21 = L'\0';
      do {
        while( true ) {
          wVar19 = piVar36[lVar34];
          wVar40 = pwVar7[lVar34];
          wVar43 = local_140[lVar34];
          local_114 = pwVar35[lVar34];
          local_150 = local_e0[lVar34];
          local_12c = local_100[lVar34];
          wVar26 = (wchar_t)lVar34;
          local_14c = wVar43;
          if (((wVar43 != wVar19) || (local_114 != wVar40)) ||
             ((local_150 != piVar8[lVar34] || (local_12c != pwVar37[lVar34])))) break;
          if ((*(int *)((long)pvVar23 + lVar34 * 4) != 0) &&
             ((wVar19 = (*Term->dblh_hook)(wVar19,wVar40), wVar19 != L'\0' ||
              (wVar19 = (*Term->dblh_hook)(local_150,local_12c), wVar19 != L'\0')))) {
LAB_001f0286:
            *(undefined4 *)((long)pvVar23 + lVar34 * 4) = 1;
            p = local_148;
            uVar29 = local_138;
            wVar43 = local_14c;
            goto LAB_001f01a4;
          }
          wVar19 = local_b0[lVar34];
          wVar40 = local_a8[lVar34];
          local_128 = CONCAT44(local_128._4_4_,local_a0[lVar34]);
          local_f0 = (wchar_t *)CONCAT44(local_f0._4_4_,local_d8[lVar34]);
          wVar43 = local_d0[lVar34];
          local_e8 = (wchar_t *)CONCAT44(local_e8._4_4_,local_c8[lVar34]);
          local_98 = (wchar_t *)CONCAT44(local_98._4_4_,local_c0[lVar34]);
          local_f4 = local_b8[lVar34];
          wVar20 = (*Term->dblh_hook)(wVar19,wVar40);
          if (wVar20 != L'\0') {
LAB_001f0109:
            if ((wVar43 == wVar19) && ((wchar_t)local_e8 == wVar40)) {
              if (((int)local_98 == (wchar_t)local_128) && (local_f4 == (wchar_t)local_f0))
              goto LAB_001f0148;
            }
            goto LAB_001f0286;
          }
          wVar20 = (*Term->dblh_hook)((wchar_t)local_128,(wchar_t)local_f0);
          if (wVar20 != L'\0') goto LAB_001f0109;
LAB_001f0148:
          wVar43 = local_14c;
          if (local_14c == L'ÿ' || -1 < (char)local_14c) {
            *(undefined4 *)((long)pvVar23 + lVar34 * 4) = 0;
          }
          else {
            wVar19 = is_padding_changed(Term,wVar27,wVar26);
            *(wchar_t *)((long)pvVar23 + lVar34 * 4) = wVar19;
            p = local_148;
            uVar29 = local_138;
            if (wVar19 != L'\0') goto LAB_001f01a4;
          }
          uVar29 = local_138;
          p = local_148;
          if (wVar18 == L'\0') {
            wVar18 = L'\0';
          }
          else {
            if ((wVar42 == L'\0') && ((char)local_110 == '\0')) {
              (*Term->wipe_hook)(wVar21,wVar27,wVar18);
              wVar42 = L'\0';
            }
            else {
              (*Term->text_hook)(wVar21,wVar27,wVar18,wVar42,pwVar35 + wVar21);
            }
            wVar18 = L'\0';
          }
LAB_001f032f:
          wVar26 = wVar21;
          lVar34 = lVar34 + 1;
          iVar39 = (int)uVar29;
          wVar21 = wVar26;
          if (iVar39 == (int)lVar34) {
            if (wVar18 == L'\0') goto LAB_001f0cd4;
            goto LAB_001f0836;
          }
        }
        *(undefined4 *)((long)pvVar23 + lVar34 * 4) = 1;
LAB_001f01a4:
        iVar39 = (int)uVar29;
        piVar36[lVar34] = wVar43;
        pwVar7[lVar34] = local_114;
        piVar8[lVar34] = local_150;
        pwVar37[lVar34] = local_12c;
        if ((char)wVar43 < '\0') {
          if (wVar18 != L'\0') {
            if ((wVar42 == L'\0') && ((char)local_110 == '\0')) {
              (*Term->wipe_hook)(wVar21,wVar27,wVar18);
              wVar43 = local_14c;
            }
            else {
              (*Term->text_hook)(wVar21,wVar27,wVar18,wVar42,pwVar35 + wVar21);
              wVar43 = local_14c;
            }
          }
          wVar18 = L'\0';
          if (wVar43 != L'ÿ') {
            (*Term->pict_hook)(wVar26,wVar27,L'\x01',&local_14c,&local_114,&local_150,&local_12c);
            wVar18 = L'\0';
          }
          goto LAB_001f032f;
        }
        if (wVar42 == wVar43) {
          bVar45 = wVar18 == L'\0';
          wVar18 = wVar18 + L'\x01';
          if (bVar45) {
            wVar21 = wVar26;
          }
          goto LAB_001f032f;
        }
        if (wVar18 != L'\0') {
          if ((wVar42 == L'\0') && ((char)local_110 == '\0')) {
            (*Term->wipe_hook)(wVar21,wVar27,wVar18);
          }
          else {
            (*Term->text_hook)(wVar21,wVar27,wVar18,wVar42,pwVar35 + wVar21);
          }
        }
        lVar34 = lVar34 + 1;
        wVar18 = L'\x01';
        wVar42 = local_14c;
        wVar21 = wVar26;
      } while (iVar39 != (int)lVar34);
LAB_001f0836:
      if ((wVar42 == L'\0') && ((char)local_110 == '\0')) {
        (*Term->wipe_hook)(wVar26,(int)local_108 + L'\xffffffff',wVar18);
      }
      else {
        (*Term->text_hook)(wVar26,(int)local_108 + L'\xffffffff',wVar18,wVar42,pwVar35 + wVar26);
      }
LAB_001f0cd4:
      ptVar44 = Term;
      if (iVar39 < Term->wid) {
        lVar41 = (long)iVar39;
        do {
          *(undefined4 *)((long)pvVar23 + lVar41 * 4) = 0;
          lVar41 = lVar41 + 1;
        } while (lVar41 < ptVar44->wid);
      }
      local_16c = (local_16c + 1) % (int)(uint)tile_height;
      ptVar38 = local_120;
    }
    else {
      pwVar35 = ptVar44->scr->c[lVar41 + -1];
      _Var1 = ptVar44->always_text;
      piVar36 = ptVar44->scr->a[lVar41 + -1];
      pwVar7 = ptVar44->old->c[lVar41 + -1];
      piVar8 = ptVar44->old->a[lVar41 + -1];
      wVar18 = L'\x01';
      lVar34 = 0;
      wVar42 = L'\0';
      wVar21 = L'\0';
      do {
        wVar19 = piVar36[(int)uVar24 + lVar34];
        wVar40 = pwVar35[(int)uVar24 + lVar34];
        if ((wVar19 == piVar8[(int)uVar24 + lVar34]) && (wVar40 == pwVar7[(int)uVar24 + lVar34])) {
          if (wVar42 == L'\0') {
            wVar42 = L'\0';
          }
          else {
            if ((wVar18 == L'\0') && (_Var1 == false)) {
              (*Term->wipe_hook)(wVar21,wVar27,wVar42);
              wVar18 = L'\0';
            }
            else {
              (*Term->text_hook)(wVar21,wVar27,wVar42,wVar18,pwVar35 + wVar21);
            }
            wVar42 = L'\0';
          }
        }
        else {
          piVar8[(int)uVar24 + lVar34] = wVar19;
          pwVar7[(int)uVar24 + lVar34] = wVar40;
          if (wVar18 == wVar19) {
            bVar45 = wVar42 == L'\0';
            wVar42 = wVar42 + L'\x01';
            if (bVar45) {
              wVar21 = uVar24 + (int)lVar34;
            }
          }
          else {
            wVar40 = uVar24 + (int)lVar34;
            if (wVar42 == L'\0') {
              wVar42 = L'\x01';
              p = local_148;
              wVar18 = wVar19;
              wVar21 = wVar40;
            }
            else {
              if ((wVar18 == L'\0') && (_Var1 == false)) {
                (*Term->wipe_hook)(wVar21,wVar27,wVar42);
              }
              else {
                (*Term->text_hook)(wVar21,wVar27,wVar42,wVar18,pwVar35 + wVar21);
              }
              wVar42 = L'\x01';
              lVar41 = local_108;
              p = local_148;
              wVar18 = wVar19;
              wVar21 = wVar40;
            }
          }
        }
        ptVar38 = local_120;
        lVar34 = lVar34 + 1;
      } while (~uVar16 + uVar24 + (int)lVar34 != 0);
      if (wVar42 != L'\0') {
        if ((wVar18 == L'\0') && (_Var1 == false)) {
          (*Term->wipe_hook)(wVar21,(int)lVar41 + L'\xffffffff',wVar42);
        }
        else {
          (*Term->text_hook)(wVar21,(int)lVar41 + L'\xffffffff',wVar42,wVar18,pwVar35 + wVar21);
        }
      }
    }
    goto LAB_001f0d3a;
  }
LAB_001ef3c8:
  if (ptVar44->soft_cursor != true) {
    if (ptVar2->cu == false) {
      _Var1 = ptVar2->cv;
      (*ptVar44->curs_hook)(ptVar2->cx,ptVar2->cy);
      if ((_Var1 == true) && (Term->xtra_hook != (_func_errr_wchar_t_wchar_t *)0x0)) {
        (*Term->xtra_hook)(L'\x04',L'\x01');
      }
    }
    else {
      (*ptVar44->curs_hook)(uVar17 + L'\xffffffff',ptVar2->cy);
    }
    ptVar2->cnx = 1;
    uVar17 = 1;
    uVar24 = 1;
    goto LAB_001ef544;
  }
  if ((ptVar2->cu == false) && (ptVar2->cv == true)) {
    if ((((tile_width < 2) && (tile_height < 2)) || (smlcurs != false)) ||
       ((ptVar44->saved != '\0' || (wVar27 = ptVar2->cy, wVar27 < L'\x01')))) {
      if (bigcurs != true) {
        (*ptVar44->curs_hook)(ptVar2->cx,ptVar2->cy);
        ptVar2->cnx = 1;
        goto LAB_001ef4e4;
      }
      wVar27 = ptVar2->cy;
    }
    (*ptVar44->bigcurs_hook)(ptVar2->cx,wVar27);
    uVar24 = (uint)tile_width;
    ptVar2->cnx = uVar24;
    uVar17 = (uint)tile_height;
  }
  else {
    ptVar2->cnx = 1;
LAB_001ef4e4:
    uVar17 = 1;
    uVar24 = 1;
  }
LAB_001ef544:
  ptVar2->cny = uVar17;
  ptVar38->cu = ptVar2->cu;
  ptVar38->cv = ptVar2->cv;
  iVar39 = ptVar2->cy;
  ptVar38->cx = ptVar2->cx;
  ptVar38->cy = iVar39;
  ptVar38->cnx = uVar24;
  ptVar38->cny = uVar17;
  if (Term->xtra_hook != (_func_errr_wchar_t_wchar_t *)0x0) {
    (*Term->xtra_hook)(L'\x06',L'\0');
  }
  return 0;
LAB_001f0b70:
  if (wVar42 != L'\0') {
    if (((ulong)local_e0 & 1) == 0) {
      (*Term->wipe_hook)(wVar21,wVar27,wVar42);
    }
    else {
      (*Term->text_hook)(wVar21,wVar27,wVar42,(wchar_t)local_140,pwVar7 + wVar21);
    }
  }
  wVar21 = iVar39 + L'\xffffffff';
  wVar42 = L'\x01';
  bVar14 = (byte)local_138;
  if (-uVar16 + iVar39 == 1) goto code_r0x001f0be8;
  goto LAB_001f0907;
code_r0x001f0be8:
  local_140 = (wchar_t *)CONCAT44(local_140._4_4_,local_150);
  wVar21 = iVar39 + L'\xffffffff';
  wVar42 = L'\x01';
LAB_001f0c34:
  ptVar38 = local_120;
  if (((wchar_t)local_140 == L'\0') && ((byte)local_138 == '\0')) {
    (*Term->wipe_hook)(wVar21,(int)local_108 + L'\xffffffff',wVar42);
  }
  else {
    (*Term->text_hook)(wVar21,(int)local_108 + L'\xffffffff',wVar42,(wchar_t)local_140,
                       pwVar7 + wVar21);
  }
LAB_001f0d3a:
  lVar41 = local_108;
  ptVar44 = Term;
  if ((Term->never_frosh == false) && (Term->xtra_hook != (_func_errr_wchar_t_wchar_t *)0x0)) {
    (*Term->xtra_hook)(L'\x05',(int)local_108 + L'\xffffffff');
    ptVar44 = Term;
  }
LAB_001f0d89:
  if (-iVar12 + (int)lVar41 == 1) goto code_r0x001f0d96;
  goto LAB_001ef608;
code_r0x001f0d96:
  if (p != (void *)0x0) {
    if (tile_height != '\0') {
      uVar29 = 0;
      do {
        mem_free(*(void **)((long)p + uVar29 * 8));
        uVar29 = uVar29 + 1;
      } while (uVar29 < tile_height);
    }
    mem_free(p);
    ptVar44 = Term;
  }
  goto LAB_001ef3c8;
}

Assistant:

errr Term_fresh(void)
{
	int x, y;

	int w = Term->wid;
	int h = Term->hgt;

	int y1 = Term->y1;
	int y2 = Term->y2;

	term_win *old = Term->old;
	term_win *scr = Term->scr;


	/* Do nothing unless "mapped" */
	if (!Term->mapped_flag) return (1);


	/* Trivial Refresh */
	if ((y1 > y2) &&
	    (scr->cu == old->cu) &&
	    (scr->cv == old->cv) &&
	    (scr->cx == old->cx) &&
	    (scr->cy == old->cy) &&
	    (scr->cnx == old->cnx) &&
	    (scr->cny == old->cny) &&
	    !(Term->total_erase)) {
		/* Nothing */
		return (1);
	}


	/* Paranoia -- use "fake" hooks to prevent core dumps */
	if (!Term->curs_hook) Term->curs_hook = Term_curs_hack;
	if (!Term->bigcurs_hook) Term->bigcurs_hook = Term->curs_hook;
	if (!Term->wipe_hook) Term->wipe_hook = Term_wipe_hack;
	if (!Term->text_hook) Term->text_hook = Term_text_hack;
	if (!Term->pict_hook) Term->pict_hook = Term_pict_hack;


	/* Handle "total erase" */
	if (Term->total_erase) {
		/* Physically erase the entire window */
		Term_xtra(TERM_XTRA_CLEAR, 0);

		/* Hack -- clear all "cursor" data */
		old->cv = old->cu = false;
		old->cx = old->cy = 0;
		old->cnx = old->cny = 1;

		/* Wipe each row */
		for (y = 0; y < h; y++) {
			int *aa = old->a[y];
			wchar_t *cc = old->c[y];
			int *taa = old->ta[y];
			wchar_t *tcc = old->tc[y];

			/* Wipe each column */
			for (x = 0; x < w; x++) {
				/* Wipe each grid */
				*aa++ = COLOUR_WHITE;
				*cc++ = ' ';

				*taa++ = COLOUR_WHITE;
				*tcc++ = ' ';
			}
		}

		/* Redraw every row */
		Term->y1 = y1 = 0;
		Term->y2 = y2 = h - 1;

		/* Redraw every column */
		for (y = 0; y < h; y++) {
			Term->x1[y] = 0;
			Term->x2[y] = w - 1;
		}

		/* Forget "total erase" */
		Term->total_erase = false;
	}


	/* Cursor update -- Erase old Cursor */
	if (Term->soft_cursor) {
		/* Cursor was visible */
		if (!old->cu && old->cv) {
		        /*
		         * Fake a change at the old cursor position so that
		         * position will be redrawn along with any other
			 * changes.
			 */
			int mty = MAX(old->cy,
				MIN(old->cy + old->cny - 1, h - 1));
			int mtx = MAX(old->cx,
				MIN(old->cx + old->cnx - 1, w - 1));
			int ty;

			for (ty = old->cy; ty <= mty; ++ty) {
				int tx;

				for (tx = old->cx; tx <= mtx; ++tx) {
					old->c[ty][tx] = ~scr->c[ty][tx];
				}
				if (Term->x1[ty] > old->cx) {
					Term->x1[ty] = old->cx;
				}
				if (Term->x2[ty] < mtx) {
					Term->x2[ty] = mtx;
				}
			}
			if (y1 > old->cy) {
			    y1 = old->cy;
			}
			if (y2 < mty) {
			    y2 = mty;
			}
		}
	} else {
		/* Cursor will be invisible */
		if (scr->cu || !scr->cv)
			Term_xtra(TERM_XTRA_SHAPE, 0);
	}


	/* Something to update */
	if (y1 <= y2) {
		int **pr_drw;
		int ipr;

		if (Term->dblh_hook && (Term->always_pict ||
				Term->higher_pict)) {
			/*
			 * Have to track whether each location in the previous
			 * tile_height rows was redrawn.  First dimension in
			 * pr_drw will be treated circularly so there's no
			 * need for copying or swapping pointers.
			 */
			pr_drw = mem_alloc(tile_height * sizeof(*pr_drw));
			for (y = 0; y < tile_height; ++y) {
				pr_drw[y] = mem_zalloc(w * sizeof(**pr_drw));
			}
		} else {
			pr_drw = NULL;
		}

		/* Handle "icky corner" */
		if ((Term->icky_corner) && (y2 >= h - 1) && (Term->x2[h - 1] > w - 2))
			Term->x2[h - 1] = w - 2;


		/*
		 * Make the stored y bounds for the modified region empty.
		 * Do so before drawing so that Term_mark() calls from within
		 * the drawing hooks will adjust the bounds on the modified
		 * region for the next update.
		 */
		Term->y1 = h;
		Term->y2 = 0;

		/* Scan the "modified" rows */
		ipr = 0;
		for (y = y1; y <= y2; ++y) {
			int x1 = Term->x1[y];
			int x2 = Term->x2[y];

			/* Flush each "modified" row */
			if (x1 <= x2) {
				/*
				 * As above, set the bounds for the modified
				 * region to be empty before drawing.
				 */
				Term->x1[y] = w;
				Term->x2[y] = 0;

				/* Use "Term_pict()" - always, sometimes or never */
				if (Term->always_pict) {
					/* Flush the row */
					if (Term->dblh_hook) {
						Term_fresh_row_pict_dblh(
							y, x1, x2, pr_drw[ipr]);
						ipr = (ipr + 1) % tile_height;
					} else {
						Term_fresh_row_pict(y, x1, x2);
					}
				} else if (Term->higher_pict) {
					/* Flush the row */
					if (Term->dblh_hook) {
						Term_fresh_row_both_dblh(
							y, x1, x2, pr_drw[ipr]);
						ipr = (ipr + 1) % tile_height;
					} else {
						Term_fresh_row_both(y, x1, x2);
					}
				} else {
					/* Flush the row */
					Term_fresh_row_text(y, x1, x2);
				}
				/* Hack -- Flush that row (if allowed) */
				if (!Term->never_frosh) Term_xtra(TERM_XTRA_FROSH, y);
			} else if (pr_drw) {
				/*
				 * Remember that nothing was redrawn on that
				 * row.
				 */
				for (x = 0; x < w; ++x) {
					pr_drw[ipr][x] = 0;
				}
				ipr = (ipr + 1) % tile_height;
			}
		}

		if (pr_drw) {
			for (y = 0; y < tile_height; ++y) {
				mem_free(pr_drw[y]);
			}
			mem_free(pr_drw);
		}
	}


	/* Cursor update -- Show new Cursor */
	if (Term->soft_cursor) {
		/* Draw the (large or small) cursor */
		if (!scr->cu && scr->cv) {
			if ((((tile_width > 1)||(tile_height > 1)) &&
			     (!smlcurs) && (Term->saved == 0) && (scr->cy > 0))
			    || bigcurs) {
				(void)((*Term->bigcurs_hook)(scr->cx, scr->cy));
				scr->cnx = tile_width;
				scr->cny = tile_height;
			} else {
				(void)((*Term->curs_hook)(scr->cx, scr->cy));
				scr->cnx = 1;
				scr->cny = 1;
			}
		} else {
			scr->cnx = 1;
			scr->cny = 1;
		}
	} else {
		/* The cursor is useless or invisible ignore it, otherwise display */
		if (scr->cu) {
			/* Paranoia -- Put the cursor NEAR where it belongs */
			(void)((*Term->curs_hook)(w - 1, scr->cy));
		} else if (!scr->cv) {
			/* Paranoia -- Put the cursor where it belongs */
			(void)((*Term->curs_hook)(scr->cx, scr->cy));
		} else {
			/* Put the cursor where it belongs */
			(void)((*Term->curs_hook)(scr->cx, scr->cy));

			/* Make the cursor visible */
			Term_xtra(TERM_XTRA_SHAPE, 1);
		}

		scr->cnx = 1;
		scr->cny = 1;
	}

	/* Save the "cursor state" */
	old->cu = scr->cu;
	old->cv = scr->cv;
	old->cx = scr->cx;
	old->cy = scr->cy;
	old->cnx = scr->cnx;
	old->cny = scr->cny;

	/* Actually flush the output */
	Term_xtra(TERM_XTRA_FRESH, 0);

	/* Success */
	return (0);
}